

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QSqlField *f)

{
  QTextStream *pQVar1;
  QArrayData *pQVar2;
  PrivateShared *pPVar3;
  char cVar4;
  storage_type *psVar5;
  long in_RDX;
  long lVar6;
  char *pcVar7;
  undefined8 *puVar8;
  char16_t *pcVar9;
  storage_type *psVar10;
  char *pcVar11;
  QArrayData *pQVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QDebugStateSaver saver;
  QDebug local_70;
  undefined8 local_68;
  QDebug local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_68,(QDebug *)f);
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  pQVar1[0x30] = (QTextStream)0x0;
  QVar13.m_data = (storage_type *)0xa;
  QVar13.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar13);
  QTextStream::operator<<(pQVar1,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  pQVar2 = *(QArrayData **)(*(long *)(in_RDX + 0x20) + 8);
  puVar8 = *(undefined8 **)(*(long *)(in_RDX + 0x20) + 0x10);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar8 == (undefined8 *)0x0) {
    puVar8 = &QString::_empty;
  }
  QDebug::putString((QChar *)f,(ulong)puVar8);
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  QVar14.m_data = (storage_type *)0x2;
  QVar14.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar14);
  QTextStream::operator<<(pQVar1,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  lVar6 = *(long *)(*(long *)(in_RDX + 0x20) + 0x58);
  if (lVar6 == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = *(long *)(lVar6 + 0x18);
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (lVar6 == 0) {
    psVar10 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar10 = psVar5 + 1;
      pcVar7 = psVar5 + lVar6 + 1;
      psVar5 = psVar10;
    } while (*pcVar7 != '\0');
  }
  QVar15.m_data = psVar10;
  QVar15.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar15);
  QTextStream::operator<<(pQVar1,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  QVar16.m_data = (storage_type *)0xd;
  QVar16.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar16);
  QTextStream::operator<<(pQVar1,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  pQVar2 = *(QArrayData **)(*(long *)(in_RDX + 0x20) + 0x20);
  lVar6 = *(long *)(*(long *)(in_RDX + 0x20) + 0x30);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar6 == 0) {
    pcVar9 = L"(not specified)";
    pQVar12 = (QArrayData *)0x0;
  }
  else {
    pQVar12 = *(QArrayData **)(*(long *)(in_RDX + 0x20) + 0x20);
    pcVar9 = *(char16_t **)(*(long *)(in_RDX + 0x20) + 0x28);
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (pcVar9 == (char16_t *)0x0) {
    pcVar9 = (char16_t *)&QString::_empty;
  }
  QDebug::putString((QChar *)f,(ulong)pcVar9);
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar12,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (-1 < *(int *)(*(long *)(in_RDX + 0x20) + 100)) {
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    QVar17.m_data = (storage_type *)0xa;
    QVar17.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<(pQVar1,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
    }
    QTextStream::operator<<
              ((QTextStream *)(f->val).d.data.shared,*(int *)(*(long *)(in_RDX + 0x20) + 100));
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
    }
  }
  if (-1 < *(int *)(*(long *)(in_RDX + 0x20) + 0x68)) {
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    QVar18.m_data = (storage_type *)0xd;
    QVar18.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<(pQVar1,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
    }
    QTextStream::operator<<
              ((QTextStream *)(f->val).d.data.shared,*(int *)(*(long *)(in_RDX + 0x20) + 0x68));
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
    }
  }
  if (*(int *)(*(long *)(in_RDX + 0x20) + 0x60) != -1) {
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    QVar19.m_data = (storage_type *)0xc;
    QVar19.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<(pQVar1,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
    }
    pcVar7 = "no";
    if (*(int *)(*(long *)(in_RDX + 0x20) + 0x60) == 1) {
      pcVar7 = "yes";
    }
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar11 = psVar10 + (long)(pcVar7 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar11 != '\0');
    QVar20.m_data = psVar10;
    QVar20.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar20);
    QTextStream::operator<<(pQVar1,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  QVar21.m_data = (storage_type *)0xd;
  QVar21.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar21);
  QTextStream::operator<<(pQVar1,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  pcVar7 = "yes";
  if ((*(byte *)(*(long *)(in_RDX + 0x20) + 0x70) & 2) == 0) {
    pcVar7 = "no";
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  psVar10 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar11 = psVar10 + (long)(pcVar7 + 1);
    psVar10 = psVar10 + 1;
  } while (*pcVar11 != '\0');
  QVar22.m_data = psVar10;
  QVar22.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar22);
  QTextStream::operator<<(pQVar1,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  QVariant::QVariant((QVariant *)&local_58,(QVariant *)(*(long *)(in_RDX + 0x20) + 0x38));
  cVar4 = QVariant::isNull();
  QVariant::~QVariant((QVariant *)&local_58);
  if (cVar4 == '\0') {
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    QVar23.m_data = (storage_type *)0x11;
    QVar23.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar23);
    QTextStream::operator<<(pQVar1,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    pQVar1 = (QTextStream *)(f->val).d.data.shared;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
    }
    QVariant::QVariant((QVariant *)&local_58,(QVariant *)(*(long *)(in_RDX + 0x20) + 0x38));
    local_60.stream = (Stream *)(f->val).d.data.shared;
    *(int *)((PrivateShared *)local_60.stream + 0x28) =
         *(int *)((PrivateShared *)local_60.stream + 0x28) + 1;
    QVariant::qdebugHelper((Stream *)&local_70);
    QDebug::~QDebug(&local_60);
    QTextStream::operator<<((QTextStream *)local_70.stream,'\"');
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    QDebug::~QDebug(&local_70);
    QVariant::~QVariant((QVariant *)&local_58);
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  QVar24.m_data = (storage_type *)0xd;
  QVar24.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar24);
  QTextStream::operator<<(pQVar1,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  pcVar11 = "true";
  pcVar7 = "true";
  if ((*(byte *)(*(long *)(in_RDX + 0x20) + 0x70) & 4) == 0) {
    pcVar7 = "false";
  }
  QTextStream::operator<<((QTextStream *)(f->val).d.data.shared,pcVar7);
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  QVar25.m_data = (storage_type *)0xc;
  QVar25.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar25);
  QTextStream::operator<<(pQVar1,(QString *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  if ((*(byte *)(*(long *)(in_RDX + 0x20) + 0x70) & 1) == 0) {
    pcVar11 = "false";
  }
  QTextStream::operator<<((QTextStream *)(f->val).d.data.shared,pcVar11);
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  QTextStream::operator<<((QTextStream *)(f->val).d.data.shared,')');
  pQVar1 = (QTextStream *)(f->val).d.data.shared;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
  }
  pPVar3 = (f->val).d.data.shared;
  (f->val).d.data.shared = (PrivateShared *)0x0;
  *(PrivateShared **)dbg.stream = pPVar3;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QSqlField &f)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QSqlField(" << f.name() << ", " << f.metaType().name();
    dbg << ", tableName: " << (f.tableName().isEmpty() ? QStringLiteral("(not specified)") : f.tableName());
    if (f.length() >= 0)
        dbg << ", length: " << f.length();
    if (f.precision() >= 0)
        dbg << ", precision: " << f.precision();
    if (f.requiredStatus() != QSqlField::Unknown)
        dbg << ", required: "
            << (f.requiredStatus() == QSqlField::Required ? "yes" : "no");
    dbg  << ", generated: " << (f.isGenerated() ? "yes" : "no");
    if (!f.defaultValue().isNull())
        dbg << ", defaultValue: \"" << f.defaultValue() << '\"';
    dbg << ", autoValue: " << f.isAutoValue()
        << ", readOnly: " << f.isReadOnly() << ')';
    return dbg;
}